

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
SetPropertyWithAttributes
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  int *piVar1;
  Type *pTVar2;
  RecyclerWeakReference<Js::DynamicObject> *pRVar3;
  JavascriptLibrary *pJVar4;
  code *pcVar5;
  PropertyRecord *this_00;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_01;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  uint32 index;
  int iVar9;
  BOOL BVar10;
  PropertyId propertyId_00;
  undefined4 *puVar11;
  PropertyRecord **ppPVar12;
  DictionaryTypeHandlerBase<int> *pDVar13;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this_02;
  ScriptContext *this_03;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_58;
  int i;
  undefined4 *local_48;
  Var local_40;
  SimpleDictionaryPropertyDescriptor<int> *local_38;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  
  _i = info;
  local_40 = value;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92a,"(instance)","instance");
    if (!bVar6) goto LAB_00dda4ac;
    *puVar11 = 0;
  }
  this_03 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  propertyRecord = (PropertyRecord *)this_03;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92f,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar6) goto LAB_00dda4ac;
    *puVar11 = 0;
    this_03 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
  }
  local_68 = ScriptContext::GetPropertyName(this_03,propertyId);
  bVar6 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_68,&local_38,(int *)&local_58);
  if (!bVar6) {
    if (local_68->isNumeric != true) {
      BVar10 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
               AddProperty<Js::PropertyRecord_const*>
                         ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)
                          this,instance,local_68,local_40,attributes,_i,flags,possibleSideEffects);
      return BVar10;
    }
    index = PropertyRecord::GetNumericValue(local_68);
    BVar10 = DynamicTypeHandler::SetItemWithAttributes
                       (&this->super_DynamicTypeHandler,instance,index,local_40,attributes);
    return BVar10;
  }
  bVar7 = local_38->Attributes;
  if ((bVar7 & 0x10) != (attributes & 0x10)) {
    pDVar13 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
              ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<int>,Js::PropertyRecord_const*>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)
                         this,instance);
    piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->
              convertSimpleDictionaryToDictionaryCount;
    *piVar1 = *piVar1 + 1;
    iVar9 = (*(pDVar13->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                      (pDVar13,instance,(ulong)(uint)propertyId,local_40,(ulong)attributes,_i,
                       (ulong)flags,(ulong)possibleSideEffects);
    return iVar9;
  }
  if ((bVar7 & 0x18) == 8) {
    bVar7 = (this->super_DynamicTypeHandler).flags;
    if ((bVar7 & 4) != 0) goto LAB_00dda1bf;
    pTVar2 = (instance->super_RecyclableObject).type.ptr;
    if (*(char *)&pTVar2[1].javascriptLibrary.ptr == '\x01') {
      if (((bVar7 & 0x10) != 0) || (*(char *)((long)&pTVar2[1].javascriptLibrary.ptr + 1) == '\x01')
         ) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_48 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *local_48 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x960,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar6) goto LAB_00dda4ac;
        *local_48 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
    if (((this->field_0x28 & 2) != 0) &&
       (bVar6 = SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>::
                TryUndeleteProperty((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>
                                     *)this,instance,local_38->propertyIndex,(int *)&local_58),
       bVar6)) {
      ppPVar12 = JsUtil::
                 BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt((this->propertyMap).ptr,(int)local_58);
      if (*ppPVar12 != local_68) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_48 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *local_48 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x96b,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord)"
                                   );
        if (!bVar6) goto LAB_00dda4ac;
        *local_48 = 0;
      }
      local_38 = JsUtil::
                 BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt((this->propertyMap).ptr,(int)local_58);
    }
    bVar6 = SupportsSwitchingToUnordered(this,(ScriptContext *)propertyRecord);
    if (bVar6) {
      this->numDeletedProperties = this->numDeletedProperties + 0xff;
    }
    ScriptContext::InvalidateProtoCaches((ScriptContext *)propertyRecord,propertyId);
    local_38->Attributes = '\a';
    bVar7 = 7;
  }
  if (bVar7 != attributes) {
    bVar7 = (this->super_DynamicTypeHandler).flags;
    if ((bVar7 & 4) != 0) {
LAB_00dda1bf:
      this_02 = ConvertToNonSharedSimpleDictionaryType(this,instance);
      BVar10 = SetPropertyWithAttributes
                         (this_02,instance,propertyId,local_40,attributes,_i,flags,
                          possibleSideEffects);
      return BVar10;
    }
    pTVar2 = (instance->super_RecyclableObject).type.ptr;
    if (*(char *)&pTVar2[1].javascriptLibrary.ptr == '\x01') {
      if (((bVar7 & 0x10) != 0) || (*(char *)((long)&pTVar2[1].javascriptLibrary.ptr + 1) == '\x01')
         ) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_48 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *local_48 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x997,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar6) goto LAB_00dda4ac;
        *local_48 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
    local_38->Attributes = attributes;
  }
  if (local_38->propertyIndex == -1) goto LAB_00dda3d4;
  pRVar3 = (this->singletonInstance).ptr;
  if (pRVar3 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    bVar6 = false;
  }
  else if ((DynamicObject *)(pRVar3->super_RecyclerWeakReferenceBase).strongRef == instance) {
    bVar6 = true;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x9a5,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar6) goto LAB_00dda4ac;
    *puVar11 = 0;
    bVar6 = false;
  }
  if ((*(byte *)local_38 & 2) == 0) {
    if ((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (*(byte *)local_38 = *(byte *)local_38 | 2, bVar6)) &&
       ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < (uint)propertyId)) {
      if (((this->super_DynamicTypeHandler).flags & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9af,"(!GetIsShared())","!GetIsShared()");
        if (!bVar6) goto LAB_00dda4ac;
        *puVar11 = 0;
      }
      if (local_40 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9b0,"(value != nullptr)","value != nullptr");
        if (!bVar6) goto LAB_00dda4ac;
        *puVar11 = 0;
      }
      BVar10 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
      if (BVar10 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9b2,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar6) {
LAB_00dda4ac:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar11 = 0;
      }
      bVar6 = VarIs<Js::JavascriptFunction>(local_40);
      if (bVar6) {
        bVar6 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixMethodPropsPhase);
        bVar7 = *(byte *)local_38;
        if (bVar6) goto LAB_00dda49e;
LAB_00dda49a:
        bVar8 = 4;
      }
      else {
        bVar6 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixDataPropsPhase);
        if (bVar6) {
          bVar7 = *(byte *)local_38;
        }
        else {
          bVar6 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,propertyId,local_40)
          ;
          bVar7 = *(byte *)local_38;
          if (bVar6) goto LAB_00dda49a;
        }
LAB_00dda49e:
        bVar8 = 0;
      }
      *(byte *)local_38 = bVar7 & 0xfb | bVar8;
    }
  }
  else {
    SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
    InvalidateFixedField<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)this,local_68
               ,local_38,
               (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
  }
  DynamicTypeHandler::SetSlotUnchecked(instance,local_38->propertyIndex,local_40);
  if (_i != (PropertyValueInfo *)0x0) {
    _i->m_instance = &instance->super_RecyclableObject;
    _i->m_propertyIndex = 0xffff;
    _i->m_attributes = '\0';
    _i->flags = InlineCacheNoFlags;
  }
LAB_00dda3d4:
  if ((local_38->Attributes & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
  }
  pJVar4 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  Memory::Recycler::WBSetBit((char *)&local_58);
  local_58 = &pJVar4->typesWithOnlyWritablePropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
  this_01 = local_58;
  if (((local_38->Attributes & 4) == 0) &&
     (DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false),
     this_00 = propertyRecord, ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    propertyId_00 =
         DynamicTypeHandler::TMapKey_GetPropertyId((ScriptContext *)propertyRecord,propertyId);
    ScriptContext::InvalidateStoreFieldCaches((ScriptContext *)this_00,propertyId_00);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_01);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,propertyId,local_40,possibleSideEffects);
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & PropertyOperation_ThrowIfNotExtensible) != 0;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((attributes & PropertyLetConstGlobal) != (descriptor->Attributes & PropertyLetConstGlobal))
            {
                // We have a shadowing case here.  Either a let/const is being declared
                // that shadows an undeclared global property or an undeclared global
                // property is being added after a let/const was already declared.
                //
                // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
                // because we do not want to add another property index field to the
                // property descriptors.  Instead convert to DictionaryTypeHandler
                // where it will reuse one of the getter/setter fields on its
                // property descriptor type.
                //
                // An exception is in the language service that will sometimes execute
                // the glo function twice causing a const or let appear to shadow itself.
                // In this case setting the property is also right.
                return
                    ConvertToDictionaryType(instance)
                        ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
            }

            if (descriptor->Attributes & PropertyDeleted && !(descriptor->Attributes & PropertyLetConstGlobal))
            {
                Assert((descriptor->Attributes & PropertyLetConstGlobal) == 0);
                if(GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else if (instance->GetDynamicType()->GetIsLocked())
                {
                    Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                    // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                    instance->ChangeType();
                }

                if(isUnordered)
                {
                    TPropertyIndex propertyIndex;
                    if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                    {
                        Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord));
                        descriptor = propertyMap->GetReferenceAt(propertyIndex);
                    }
                }

                if (IsNotExtensibleSupported)
                {
                    bool isForce = (flags & PropertyOperation_Force) != 0;
                    if (!isForce)
                    {
                        if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                        {
                            return FALSE;
                        }
                    }
                }

                if(SupportsSwitchingToUnordered(scriptContext))
                {
                    --numDeletedProperties;
                }
                scriptContext->InvalidateProtoCaches(propertyId);
                descriptor->Attributes = PropertyDynamicTypeDefaults;
            }

            if (descriptor->Attributes != attributes)
            {
                if (GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else
                {
                    if (instance->GetDynamicType()->GetIsLocked())
                    {
                        Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                        // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                        instance->ChangeType();
                    }

                    descriptor->Attributes = attributes;
                }
            }

            if (descriptor->propertyIndex != NoSlots)
            {
#if ENABLE_FIXED_FIELDS
                DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
                Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
                if (!descriptor->isInitialized)
                {
                    if ((flags & PropertyOperation_PreInit) == 0)
                    {
                        // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                        // some other special illegal value (for let or const), currently == null.
                        descriptor->isInitialized = true;
                        if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) && (flags & (PropertyOperation_SpecialValue | PropertyOperation_NonFixedValue)) == 0)
                        {
                            Assert(!GetIsShared());
                            Assert(value != nullptr);
                            // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                            Assert(!instance->IsExternal());
                            descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                        }
                    }
                }
                else
                {
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
                }
#endif
                SetSlotUnchecked(instance, descriptor->propertyIndex, value);

                if (!descriptor->IsOrMayBecomeFixed())
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
            }

            if (descriptor->Attributes & PropertyEnumerable)
            {
                instance->SetHasNoEnumerableProperties(false);
            }

            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);

            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyRecord. May create objectArray.
        if (propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetItemWithAttributes(instance, propertyRecord->GetNumericValue(), value, attributes);
        }

        return this->AddProperty(instance, propertyRecord, value, attributes, info, flags, possibleSideEffects);
    }